

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

CURLMcode curl_multi_cleanup(Curl_multi *multi)

{
  Curl_easy *pCVar1;
  CURLMcode CVar2;
  Curl_easy *data;
  
  CVar2 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    if (multi->in_callback == false) {
      multi->type = 0;
      data = multi->easyp;
      while (data != (Curl_easy *)0x0) {
        pCVar1 = data->next;
        if (((data->state).done == false) && (data->easy_conn != (connectdata *)0x0)) {
          multi_done(&data->easy_conn,CURLE_OK,true);
        }
        if ((data->dns).hostcachetype == HCACHE_MULTI) {
          Curl_hostcache_clean(data,(data->dns).hostcache);
          (data->dns).hostcache = (curl_hash *)0x0;
          (data->dns).hostcachetype = HCACHE_NONE;
        }
        (data->state).conn_cache = (conncache *)0x0;
        data->multi = (Curl_multi *)0x0;
        data = pCVar1;
      }
      Curl_conncache_close_all_connections(&multi->conn_cache);
      Curl_hash_destroy(&multi->sockhash);
      Curl_conncache_destroy(&multi->conn_cache);
      CVar2 = CURLM_OK;
      Curl_llist_destroy(&multi->msglist,(void *)0x0);
      Curl_llist_destroy(&multi->pending,(void *)0x0);
      Curl_hash_destroy(&multi->hostcache);
      Curl_pipeline_set_site_blacklist((char **)0x0,&multi->pipelining_site_bl);
      Curl_pipeline_set_server_blacklist((char **)0x0,&multi->pipelining_server_bl);
      (*Curl_cfree)(multi);
    }
    else {
      CVar2 = CURLM_RECURSIVE_API_CALL;
    }
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_cleanup(struct Curl_multi *multi)
{
  struct Curl_easy *data;
  struct Curl_easy *nextdata;

  if(GOOD_MULTI_HANDLE(multi)) {
    if(multi->in_callback)
      return CURLM_RECURSIVE_API_CALL;

    multi->type = 0; /* not good anymore */

    /* Firsrt remove all remaining easy handles */
    data = multi->easyp;
    while(data) {
      nextdata = data->next;
      if(!data->state.done && data->easy_conn)
        /* if DONE was never called for this handle */
        (void)multi_done(&data->easy_conn, CURLE_OK, TRUE);
      if(data->dns.hostcachetype == HCACHE_MULTI) {
        /* clear out the usage of the shared DNS cache */
        Curl_hostcache_clean(data, data->dns.hostcache);
        data->dns.hostcache = NULL;
        data->dns.hostcachetype = HCACHE_NONE;
      }

      /* Clear the pointer to the connection cache */
      data->state.conn_cache = NULL;
      data->multi = NULL; /* clear the association */

#ifdef USE_LIBPSL
      if(data->psl == &multi->psl)
        data->psl = NULL;
#endif

      data = nextdata;
    }

    /* Close all the connections in the connection cache */
    Curl_conncache_close_all_connections(&multi->conn_cache);

    Curl_hash_destroy(&multi->sockhash);
    Curl_conncache_destroy(&multi->conn_cache);
    Curl_llist_destroy(&multi->msglist, NULL);
    Curl_llist_destroy(&multi->pending, NULL);

    Curl_hash_destroy(&multi->hostcache);
    Curl_psl_destroy(&multi->psl);

    /* Free the blacklists by setting them to NULL */
    Curl_pipeline_set_site_blacklist(NULL, &multi->pipelining_site_bl);
    Curl_pipeline_set_server_blacklist(NULL, &multi->pipelining_server_bl);

    free(multi);

    return CURLM_OK;
  }
  return CURLM_BAD_HANDLE;
}